

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeodesicArcIntercept.cpp
# Opt level: O2

int GeoCalcs::GeodesicArcIntercept
              (LLPoint *pt1,double crs1,LLPoint *center,double radius,LLPoint *intPtC1,
              LLPoint *intPtC2,double dTol)

{
  double dVar1;
  int iVar2;
  LLPoint *pLVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar4;
  LLPoint LVar5;
  double dist;
  double local_110;
  double local_108;
  double local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d0;
  LLPoint local_c8;
  undefined1 local_b8 [16];
  InverseResult result;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  LLPoint perpPt;
  double local_58;
  double dDistFromPt;
  double dCrsFromPt;
  
  local_f8._8_8_ = local_f8._0_8_;
  local_108 = radius;
  local_100 = dTol;
  LVar5 = PerpIntercept(pt1,crs1,center,&dCrsFromPt,&dDistFromPt,dTol);
  perpPt.longitude = LVar5.longitude;
  perpPt.latitude = LVar5.latitude;
  result.azimuth = 0.0;
  result.reverseAzimuth = 0.0;
  result.distance = 0.0;
  DistVincenty(&perpPt,center,&result);
  iVar2 = 0;
  if (result.distance <= local_108) {
    if (local_100 <= ABS(result.distance - local_108)) {
      local_e8._0_4_ = SUB84(result.distance,0);
      local_e8._4_4_ = (undefined4)((ulong)result.distance >> 0x20);
      DistVincenty(&perpPt,pt1,&result);
      dVar1 = cos((double)CONCAT44(local_e8._4_4_,(undefined4)local_e8) / kSphereRadius);
      dVar1 = ABS(dVar1);
      dVar4 = 0.0;
      if (dVar1 <= 0.0) {
        dVar4 = dVar1;
      }
      iVar2 = 0;
      if (dVar4 * 1e-08 < dVar1) {
        local_110 = result.azimuth;
        local_d0 = kSphereRadius;
        local_f8._0_8_ = cos(local_108 / kSphereRadius);
        dVar1 = cos((double)CONCAT44(local_e8._4_4_,(undefined4)local_e8) / kSphereRadius);
        dVar1 = acos((double)local_f8._0_8_ / dVar1);
        dist = local_d0 * dVar1;
        LVar5 = DestVincenty(&perpPt,local_110,dist);
        local_c8.longitude = LVar5.longitude;
        local_c8.latitude = LVar5.latitude;
        for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar2);
          DistVincenty(center,&local_c8,&result);
          local_88 = local_108 - result.distance;
          uStack_e0 = 0;
          local_f8._0_8_ = result.reverseAzimuth;
          local_78 = dist;
          local_e8 = local_88;
          DistVincenty(&local_c8,&perpPt,&result);
          local_b8._0_8_ = result.azimuth;
          DistVincenty(center,&local_c8,&result);
          local_58 = SignAzimuthDifference(result.azimuth,result.reverseAzimuth);
          local_58 = ABS(local_58);
          dVar1 = SignAzimuthDifference((double)local_b8._0_8_,(double)local_f8._0_8_);
          local_58 = (dVar1 + 3.141592653589793) - local_58;
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_8_ = local_58;
          local_b8._12_4_ = extraout_XMM0_Dd;
          local_f8._0_8_ = sin(ABS(local_58));
          dVar1 = cos(ABS(local_e8) / kSphereRadius);
          dVar1 = acos(dVar1 * (double)local_f8._0_8_);
          local_f8._8_4_ = extraout_XMM0_Dc_00;
          local_f8._0_8_ = dVar1;
          local_f8._12_4_ = extraout_XMM0_Dd_00;
          dVar1 = sin(dVar1);
          dVar4 = local_e8;
          if (local_100 <= ABS(dVar1)) {
            if (local_100 <= ABS((double)local_f8._0_8_)) {
              local_b8._0_8_ = kSphereRadius;
              dVar1 = sin(local_e8 / kSphereRadius);
              dVar4 = sin((double)local_f8._0_8_);
              dVar4 = asin(dVar1 / dVar4);
              dVar4 = dVar4 * (double)local_b8._0_8_;
            }
            else {
              dVar4 = cos((double)local_b8._0_8_);
              dVar4 = local_e8 / dVar4;
            }
          }
          dist = (double)(~-(ulong)(0.0 < local_e8) & (ulong)-dVar4 |
                         -(ulong)(0.0 < local_e8) & (ulong)dVar4) + dist;
          LVar5 = DestVincenty(&perpPt,local_110,dist);
          local_c8.longitude = LVar5.longitude;
          local_c8.latitude = LVar5.latitude;
          DistVincenty(center,&local_c8,&result);
          while( true ) {
            local_70 = dist;
            local_80 = local_108 - result.distance;
            if (ABS(local_80) <= local_100) break;
            FindLinearRoot(&local_78,&local_88,&dist);
            if (NAN(dist)) break;
            LVar5 = DestVincenty(&perpPt,local_110,dist);
            local_c8.longitude = LVar5.longitude;
            local_c8.latitude = LVar5.latitude;
            DistVincenty(center,&local_c8,&result);
            local_78 = local_70;
            local_88 = local_80;
          }
          iVar2 = local_d0._0_4_;
          pLVar3 = intPtC2;
          if (local_d0._0_4_ == 0) {
            pLVar3 = intPtC1;
          }
          pLVar3->latitude = local_c8.latitude;
          pLVar3->longitude = local_c8.longitude;
          local_110 = local_110 + 3.141592653589793;
          LVar5 = DestVincenty(&perpPt,local_110,dist);
          local_c8.longitude = LVar5.longitude;
          local_c8.latitude = LVar5.latitude;
          DistVincenty(center,&local_c8,&result);
        }
        iVar2 = 2;
      }
    }
    else {
      intPtC1->latitude = perpPt.latitude;
      intPtC1->longitude = perpPt.longitude;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int GeodesicArcIntercept(const LLPoint &pt1, double crs1,
                             const LLPoint &center, double radius,
                             LLPoint &intPtC1, LLPoint &intPtC2, double dTol)
    {
        double dCrsFromPt, dDistFromPt;
        const LLPoint perpPt = PerpIntercept(pt1, crs1, center, dCrsFromPt, dDistFromPt, dTol);

        InverseResult result;
        DistVincenty(perpPt, center, result);

        if (result.distance > radius)
            return 0;

        if (fabs(result.distance - radius) < dTol)
        {
            intPtC1 = perpPt;
            return 1;
        }

        const double perpDist = result.distance;
        DistVincenty(perpPt, pt1, result);

        if (IsApprox(cos(perpDist / kSphereRadius), 0.0, 1e-8))
            return 0;

        double crs = result.azimuth;
        double dist = kSphereRadius * acos(cos(radius / kSphereRadius) / cos(perpDist / kSphereRadius));
        LLPoint pt = DestVincenty(perpPt, crs, dist);

        const int nIntersects = 2;
        for (int i = 0; i < nIntersects; i++)
        {
            DistVincenty(center, pt, result);
            const double rcrs = result.reverseAzimuth;
            const double dErr = radius - result.distance;

            double distarray[2], errarray[2];
            distarray[0] = dist;
            errarray[0] = dErr;

            DistVincenty(pt, perpPt, result);
            const double bcrs = result.azimuth;

            DistVincenty(center, pt, result);
            const double dAngle = fabs(SignAzimuthDifference(result.azimuth, result.reverseAzimuth));
            const double B = fabs(SignAzimuthDifference(bcrs, rcrs) + M_PI - dAngle);
            const double A = acos(sin(B) * cos(fabs(dErr) / kSphereRadius));
            double c;
            if (fabs(sin(A)) < dTol)
                c = dErr;
            else if (fabs(A) < dTol)
                c = dErr / cos(B);
            else
                c = kSphereRadius * asin(sin(dErr / kSphereRadius) / sin(A));

            dist = dErr > 0 ? dist + c : dist - c;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            distarray[1] = dist;
            errarray[1] = radius - result.distance;

            while (fabs(errarray[1]) > dTol)
            {
                FindLinearRoot(distarray, errarray, dist);
                if (std::isnan(dist))
                    break;

                pt = DestVincenty(perpPt, crs, dist);
                DistVincenty(center, pt, result);
                distarray[0] = distarray[1];
                errarray[0] = errarray[1];
                distarray[1] = dist;
                errarray[1] = radius - result.distance;
                
            }

            if (i == 0)
                intPtC1 = pt;
            else if (i == 1)
                intPtC2 = pt;
            else
                break;

            crs += M_PI;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            errarray[0] = radius - result.distance;
        }

        return nIntersects;
    }